

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void __thiscall
de::anon_unknown_0::TestThread::TestThread
          (TestThread *this,SpinBarrier *barrier,deInt32 *sharedVar,int numThreads,int threadNdx)

{
  uint uVar1;
  deUint32 dVar2;
  int threadNdx_local;
  int numThreads_local;
  deInt32 *sharedVar_local;
  SpinBarrier *barrier_local;
  TestThread *this_local;
  
  Thread::Thread(&this->super_Thread);
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__TestThread_016d0098;
  this->m_barrier = barrier;
  this->m_sharedVar = sharedVar;
  this->m_numThreads = numThreads;
  this->m_threadNdx = threadNdx;
  uVar1 = this->m_numThreads;
  dVar2 = deGetNumAvailableLogicalCores();
  this->m_busyOk = uVar1 <= dVar2;
  return;
}

Assistant:

TestThread (SpinBarrier& barrier, volatile deInt32* sharedVar, int numThreads, int threadNdx)
		: m_barrier		(barrier)
		, m_sharedVar	(sharedVar)
		, m_numThreads	(numThreads)
		, m_threadNdx	(threadNdx)
		, m_busyOk		((deUint32)m_numThreads <= deGetNumAvailableLogicalCores())
	{
	}